

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void gen_high_BATs(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict2 *env_local;
  
  _spr_register(env,0x230,"IBAT4U",spr_noaccess,spr_noaccess,spr_read_ibat_h,spr_write_ibatu_h,
                spr_read_ibat_h,spr_write_ibatu_h,0);
  _spr_register(env,0x231,"IBAT4L",spr_noaccess,spr_noaccess,spr_read_ibat_h,spr_write_ibatl_h,
                spr_read_ibat_h,spr_write_ibatl_h,0);
  _spr_register(env,0x232,"IBAT5U",spr_noaccess,spr_noaccess,spr_read_ibat_h,spr_write_ibatu_h,
                spr_read_ibat_h,spr_write_ibatu_h,0);
  _spr_register(env,0x233,"IBAT5L",spr_noaccess,spr_noaccess,spr_read_ibat_h,spr_write_ibatl_h,
                spr_read_ibat_h,spr_write_ibatl_h,0);
  _spr_register(env,0x234,"IBAT6U",spr_noaccess,spr_noaccess,spr_read_ibat_h,spr_write_ibatu_h,
                spr_read_ibat_h,spr_write_ibatu_h,0);
  _spr_register(env,0x235,"IBAT6L",spr_noaccess,spr_noaccess,spr_read_ibat_h,spr_write_ibatl_h,
                spr_read_ibat_h,spr_write_ibatl_h,0);
  _spr_register(env,0x236,"IBAT7U",spr_noaccess,spr_noaccess,spr_read_ibat_h,spr_write_ibatu_h,
                spr_read_ibat_h,spr_write_ibatu_h,0);
  _spr_register(env,0x237,"IBAT7L",spr_noaccess,spr_noaccess,spr_read_ibat_h,spr_write_ibatl_h,
                spr_read_ibat_h,spr_write_ibatl_h,0);
  _spr_register(env,0x238,"DBAT4U",spr_noaccess,spr_noaccess,spr_read_dbat_h,spr_write_dbatu_h,
                spr_read_dbat_h,spr_write_dbatu_h,0);
  _spr_register(env,0x239,"DBAT4L",spr_noaccess,spr_noaccess,spr_read_dbat_h,spr_write_dbatl_h,
                spr_read_dbat_h,spr_write_dbatl_h,0);
  _spr_register(env,0x23a,"DBAT5U",spr_noaccess,spr_noaccess,spr_read_dbat_h,spr_write_dbatu_h,
                spr_read_dbat_h,spr_write_dbatu_h,0);
  _spr_register(env,0x23b,"DBAT5L",spr_noaccess,spr_noaccess,spr_read_dbat_h,spr_write_dbatl_h,
                spr_read_dbat_h,spr_write_dbatl_h,0);
  _spr_register(env,0x23c,"DBAT6U",spr_noaccess,spr_noaccess,spr_read_dbat_h,spr_write_dbatu_h,
                spr_read_dbat_h,spr_write_dbatu_h,0);
  _spr_register(env,0x23d,"DBAT6L",spr_noaccess,spr_noaccess,spr_read_dbat_h,spr_write_dbatl_h,
                spr_read_dbat_h,spr_write_dbatl_h,0);
  _spr_register(env,0x23e,"DBAT7U",spr_noaccess,spr_noaccess,spr_read_dbat_h,spr_write_dbatu_h,
                spr_read_dbat_h,spr_write_dbatu_h,0);
  _spr_register(env,0x23f,"DBAT7L",spr_noaccess,spr_noaccess,spr_read_dbat_h,spr_write_dbatl_h,
                spr_read_dbat_h,spr_write_dbatl_h,0);
  env->nb_BATs = env->nb_BATs + 4;
  return;
}

Assistant:

static void gen_high_BATs(CPUPPCState *env)
{
    spr_register(env, SPR_IBAT4U, "IBAT4U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatu_h,
                 0x00000000);
    spr_register(env, SPR_IBAT4L, "IBAT4L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatl_h,
                 0x00000000);
    spr_register(env, SPR_IBAT5U, "IBAT5U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatu_h,
                 0x00000000);
    spr_register(env, SPR_IBAT5L, "IBAT5L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatl_h,
                 0x00000000);
    spr_register(env, SPR_IBAT6U, "IBAT6U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatu_h,
                 0x00000000);
    spr_register(env, SPR_IBAT6L, "IBAT6L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatl_h,
                 0x00000000);
    spr_register(env, SPR_IBAT7U, "IBAT7U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatu_h,
                 0x00000000);
    spr_register(env, SPR_IBAT7L, "IBAT7L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatl_h,
                 0x00000000);
    spr_register(env, SPR_DBAT4U, "DBAT4U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatu_h,
                 0x00000000);
    spr_register(env, SPR_DBAT4L, "DBAT4L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatl_h,
                 0x00000000);
    spr_register(env, SPR_DBAT5U, "DBAT5U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatu_h,
                 0x00000000);
    spr_register(env, SPR_DBAT5L, "DBAT5L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatl_h,
                 0x00000000);
    spr_register(env, SPR_DBAT6U, "DBAT6U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatu_h,
                 0x00000000);
    spr_register(env, SPR_DBAT6L, "DBAT6L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatl_h,
                 0x00000000);
    spr_register(env, SPR_DBAT7U, "DBAT7U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatu_h,
                 0x00000000);
    spr_register(env, SPR_DBAT7L, "DBAT7L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatl_h,
                 0x00000000);
    env->nb_BATs += 4;
}